

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_tools.cpp
# Opt level: O0

QString * qdtoa(qreal d,int *decpt,int *sign)

{
  QLatin1StringView latin1;
  uint *in_RDX;
  undefined4 *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  qsizetype digits;
  int length;
  int nonNullDecpt;
  bool nonNullSign;
  char result [18];
  QString *this;
  QString *pQVar1;
  char *in_stack_ffffffffffffffb8;
  undefined4 uVar2;
  uint3 in_stack_ffffffffffffffd4;
  uint uVar3;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined2 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (uint)in_stack_ffffffffffffffd4;
  uVar2 = 0;
  this = (QString *)0x12;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = 0xaaaa;
  pQVar1 = in_RDI;
  qt_doubleToAscii(in_XMM0_Qa,(DoubleForm)((ulong)in_RSI >> 0x20),(int)in_RSI,(char *)in_RDX,
                   (qsizetype)in_stack_ffffffffffffffb8,(bool *)0x12,(int *)in_RDI,
                   (int *)((ulong)uVar3 << 0x20));
  if (in_RDX != (uint *)0x0) {
    *in_RDX = (uint)((uVar3 & 0x1000000) != 0);
  }
  if (in_RSI != (undefined4 *)0x0) {
    *in_RSI = uVar2;
  }
  QLatin1String::QLatin1String((QLatin1String *)&stack0xffffffffffffffb8,(char *)&local_28,0);
  latin1.m_data = in_stack_ffffffffffffffb8;
  latin1.m_size = (qsizetype)pQVar1;
  QString::QString(this,latin1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString qdtoa(qreal d, int *decpt, int *sign)
{
    bool nonNullSign = false;
    int nonNullDecpt = 0;
    int length = 0;

    // Some versions of libdouble-conversion like an extra digit, probably for '\0'
    constexpr qsizetype digits = std::numeric_limits<double>::max_digits10 + 1;
    char result[digits];
    qt_doubleToAscii(d, QLocaleData::DFSignificantDigits, QLocale::FloatingPointShortest,
                     result, digits, nonNullSign, length, nonNullDecpt);

    if (sign)
        *sign = nonNullSign ? 1 : 0;
    if (decpt)
        *decpt = nonNullDecpt;

    return QLatin1StringView(result, length);
}